

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<false,false>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  Token *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  HashTbl *this_01;
  IdentPtr pid;
  char16 local_4a;
  HRESULT local_48;
  bool createPid;
  uint uStack_44;
  OLECHAR lower;
  uint errorType;
  codepoint_t codePoint;
  EncodedCharPtr last;
  EncodedCharPtr p;
  OLECHAR local_26;
  int wT;
  OLECHAR rawch;
  OLECHAR c;
  EncodedCharPtr *ppuStack_20;
  OLECHAR ch;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>> *pSStack_10;
  OLECHAR delim_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  last = *pp;
  _errorType = *(EncodedCharPtr *)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xfb);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf7);
  ppuStack_20 = pp;
  pp_local._6_2_ = delim;
  pSStack_10 = this;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Reset((TemporaryBuffer *)(this + 0x510))
  ;
  do {
    while( true ) {
      local_26 = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
      wT._2_2_ = local_26;
      if (local_26 == L'\0') {
        if (_errorType < last) {
          *(EncodedCharPtr *)(this + 0x4e0) = last + -1;
          Scanner<UTF8EncodingPolicyBase<false>_>::Error
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
        }
        goto LAB_015f2635;
      }
      if ((local_26 == L'\n') || (local_26 == L'\r')) {
        *(EncodedCharPtr *)(this + 0x4e0) = last + -1;
        Scanner<UTF8EncodingPolicyBase<false>_>::Error
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
      }
      if (local_26 != L'\"') break;
LAB_015f1f50:
      if (local_26 == pp_local._6_2_) {
        bVar2 = true;
        if (((((byte)this[0x508] >> 6 & 1) != 0) && (bVar2 = false, *(int *)(this + 0x51c) == 10))
           && (iVar5 = memcmp(L"use strict",*(void **)(this + 0x520),
                              (ulong)*(uint *)(this + 0x51c) << 1), iVar5 == 0)) {
          bVar2 = true;
        }
        if (bVar2) {
          this_00 = *(Token **)(this + 0x4b8);
          this_01 = Scanner<UTF8EncodingPolicyBase<false>_>::GetHashTbl
                              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
          pid = HashTbl::PidHashNameLen<char16_t>
                          (this_01,*(char16_t **)(this + 0x520),*(uint32 *)(this + 0x51c));
          Token::SetIdentifier(this_00,pid);
        }
        else {
          Token::SetIdentifier(*(Token **)(this + 0x4b8),(IdentPtr)0x0);
        }
        *(undefined4 *)(this + 0x744) = 0;
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                      ((byte)this[0x508] & 0xfd | (pp_local._6_2_ == L'\"') << 1);
        *ppuStack_20 = last;
        return tkStrCon;
      }
LAB_015f2635:
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh
                ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)wT._2_2_);
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
    }
    if (local_26 == L'$') {
LAB_015f1f98:
      BVar3 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(local_26);
      if (BVar3 != 0) {
        local_26 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                             ((UTF8EncodingPolicyBase<false> *)(this + 8),wT._2_2_,&last,_errorType)
        ;
        wT._2_2_ = local_26;
      }
      goto LAB_015f2635;
    }
    if (local_26 == L'\'') goto LAB_015f1f50;
    if (local_26 != L'\\') goto LAB_015f1f98;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
              ((TemporaryBuffer *)(this + 0x628),0x5c);
    this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] | 8);
    local_26 = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
    uStack_44 = 0;
    local_48 = -0x7ff5fc01;
    uVar4 = (uint)(ushort)local_26;
    wT._2_2_ = local_26;
    if (uVar4 == 0) {
      if (_errorType <= last) {
        local_48 = -0x7ff5fc09;
        goto LAB_015f25cc;
      }
      goto LAB_015f2635;
    }
    if ((uVar4 != 10) && (uVar4 != 0xd)) {
      if (uVar4 - 0x30 < 4) {
        wT._2_2_ = local_26 + L'￐';
        wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
        p._4_4_ = (ushort)(OLECHAR)wT - 0x30;
        if ((p._4_4_ & 0xffff) < 8) {
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xfb | 4);
          wT._2_2_ = wT._2_2_ * 8 + (short)p._4_4_;
          goto LAB_015f2542;
        }
        if ((wT._2_2_ != L'\0') || ((p._4_4_ & 0xffff) < 10)) {
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xfb | 4);
        }
        last = last + -1;
      }
      else if (uVar4 - 0x34 < 4) {
        wT._2_2_ = local_26 + L'￐';
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xfb | 4);
LAB_015f2542:
        wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
        p._4_4_ = (ushort)(OLECHAR)wT - 0x30;
        if ((p._4_4_ & 0xffff) < 8) {
          wT._2_2_ = wT._2_2_ * 8 + (short)p._4_4_;
        }
        else {
          last = last + -1;
        }
      }
      else if (uVar4 == 0x62) {
        wT._2_2_ = L'\b';
      }
      else if (uVar4 == 0x66) {
        wT._2_2_ = L'\f';
      }
      else if (uVar4 == 0x6e) {
        wT._2_2_ = L'\n';
      }
      else if (uVar4 == 0x72) {
        wT._2_2_ = L'\r';
      }
      else if (uVar4 == 0x74) {
        wT._2_2_ = L'\t';
      }
      else if (uVar4 == 0x75) {
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                  ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
        wT._2_2_ = L'\0';
        wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
        BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
        if (BVar3 == 0) {
          if (((OLECHAR)wT != L'{') || (((byte)this[0x509] & 1) == 0)) goto LAB_015f25cc;
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),0x7b);
          wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
          BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
          if (BVar3 == 0) goto LAB_015f25cc;
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
          uStack_44 = p._4_4_;
          while( true ) {
            wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
            BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
            if (BVar3 == 0) break;
            Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                      ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
            uStack_44 = p._4_4_ + uStack_44 * 0x10;
            if (0x10ffff < uStack_44) {
              local_48 = -0x7ff5fbd9;
              goto LAB_015f25cc;
            }
          }
          if ((OLECHAR)wT != L'}') {
            local_48 = -0x7ff5fbd8;
            goto LAB_015f25cc;
          }
          if (0x10ffff < uStack_44) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                               ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          if (uStack_44 < 0x10000) {
            wT._2_2_ = (OLECHAR)uStack_44;
          }
          else {
            local_4a = L'\0';
            Js::NumberUtilities::CodePointAsSurrogatePair
                      (uStack_44,&local_4a,(char16 *)((long)&wT + 2));
            Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh
                      ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_4a);
          }
        }
        else {
          uStack_44 = 0;
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
          uStack_44 = p._4_4_ * 0x1000 + uStack_44;
          wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
          BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
          if (BVar3 == 0) goto LAB_015f25cc;
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
          uStack_44 = p._4_4_ * 0x100 + uStack_44;
LAB_015f23fd:
          wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
          BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
          if (BVar3 == 0) {
LAB_015f25cc:
            *(EncodedCharPtr *)(this + 0x4e0) = last + -1;
            Scanner<UTF8EncodingPolicyBase<false>_>::Error
                      ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,local_48);
          }
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
          uStack_44 = p._4_4_ * 0x10 + uStack_44;
          wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
          BVar3 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
          if ((BVar3 == 0) || (uStack_44 = p._4_4_ + uStack_44, 0xffff < uStack_44))
          goto LAB_015f25cc;
          wT._2_2_ = (OLECHAR)uStack_44;
        }
      }
      else if (uVar4 == 0x76) {
        wT._2_2_ = L'\v';
      }
      else {
        if (uVar4 == 0x78) {
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<false>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
          wT._2_2_ = L'\0';
          goto LAB_015f23fd;
        }
        if ((uVar4 - 0x2028 < 2) ||
           ((BVar3 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(local_26), BVar3 != 0 &&
            (local_26 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                                  ((UTF8EncodingPolicyBase<false> *)(this + 8),wT._2_2_,&last,
                                   _errorType), wT._2_2_ = local_26,
            local_26 == L'\x2028' || local_26 == L'\x2029')))) goto LAB_015f258f;
      }
      goto LAB_015f2635;
    }
LAB_015f258f:
    *(EncodedCharPtr *)(this + 0x4e0) = last;
    local_26 = wT._2_2_;
    Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,(uint)(ushort)wT._2_2_);
    last = *(EncodedCharPtr *)(this + 0x4e0);
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}